

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

size_t put_ldouble(MIR_context_t ctx,writer_func_t writer,longdouble ld)

{
  size_t sVar1;
  size_t sVar2;
  size_t len;
  anon_union_16_2_0ec0f880 u;
  longdouble ld_local;
  writer_func_t writer_local;
  MIR_context_t ctx_local;
  
  if (writer == (writer_func_t)0x0) {
    ctx_local = (MIR_context_t)0x0;
  }
  else {
    len = SUB108(ld,0);
    u.u[0]._0_2_ = (undefined2)((unkuint10)ld >> 0x40);
    sVar1 = put_uint(ctx,writer,len,8);
    sVar2 = put_uint(ctx,writer,CONCAT62(u.u[0]._2_6_,u.u[0]._0_2_),8);
    ctx_local = (MIR_context_t)(sVar2 + sVar1);
  }
  return (size_t)ctx_local;
}

Assistant:

static size_t put_ldouble (MIR_context_t ctx, writer_func_t writer, long double ld) {
  union {
    uint64_t u[2];
    long double ld;
  } u;
  size_t len;

  if (writer == NULL) return 0;
  u.ld = ld;
  len = put_uint (ctx, writer, u.u[0], sizeof (uint64_t));
  return put_uint (ctx, writer, u.u[1], sizeof (uint64_t)) + len;
}